

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

void __thiscall duckdb::DuckCleanupInfo::Cleanup(DuckCleanupInfo *this)

{
  pointer puVar1;
  pointer pDVar2;
  pointer this_00;
  
  puVar1 = (this->transactions).
           super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->transactions).
                 super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pDVar2 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator->(this_00);
    if (pDVar2->awaiting_cleanup == true) {
      pDVar2 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(this_00);
      UndoBuffer::Cleanup(&pDVar2->undo_buffer,this->lowest_start_time);
    }
  }
  return;
}

Assistant:

void DuckCleanupInfo::Cleanup() noexcept {
	for (auto &transaction : transactions) {
		if (transaction->awaiting_cleanup) {
			transaction->Cleanup(lowest_start_time);
		}
	}
}